

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

char * makekey(uint8 *data,size_t len,char *key)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (char *)__ckd_calloc__(len * 2 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
                                  ,0xde);
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    pcVar1[sVar2 * 2] = (data[sVar2] & 0xf) + 0x41;
    pcVar1[sVar2 * 2 + 1] = (data[sVar2] >> 4) + 0x4a;
  }
  pcVar1[sVar2 * 2] = '\0';
  return pcVar1;
}

Assistant:

static char *
makekey(uint8 * data, size_t len, char *key)
{
    size_t i, j;

    if (!key)
        key = (char *) ckd_calloc(len * 2 + 1, sizeof(char));

    for (i = 0, j = 0; i < len; i++, j += 2) {
        key[j] = 'A' + (data[i] & 0x000f);
        key[j + 1] = 'J' + ((data[i] >> 4) & 0x000f);
    }
    key[j] = '\0';

    return key;
}